

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info)

{
  undefined4 *puVar1;
  pointer p_Var2;
  int iVar3;
  int iVar4;
  EXRChannelInfo *pEVar5;
  size_t __size;
  int *piVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  pointer p_Var11;
  long lVar12;
  pointer paVar13;
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  exr_header->display_window[0] = info->display_window[0];
  exr_header->display_window[1] = info->display_window[1];
  exr_header->display_window[2] = info->display_window[2];
  exr_header->display_window[3] = info->display_window[3];
  exr_header->data_window[0] = info->data_window[0];
  exr_header->data_window[1] = info->data_window[1];
  exr_header->data_window[2] = info->data_window[2];
  exr_header->data_window[3] = info->data_window[3];
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar7 = info->tile_size_y;
  iVar3 = info->tile_level_mode;
  iVar4 = info->tile_rounding_mode;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = iVar7;
  exr_header->tile_level_mode = iVar3;
  exr_header->tile_rounding_mode = iVar4;
  paVar13 = (info->channels).
            super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar7 = (int)((long)(info->channels).
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 4) * -0x55555555
  ;
  exr_header->num_channels = iVar7;
  pEVar5 = (EXRChannelInfo *)malloc((long)iVar7 * 0x110);
  exr_header->channels = pEVar5;
  if (iVar7 == 0) {
    iVar7 = 0;
    __size = 0;
  }
  else {
    lVar12 = 0;
    lVar10 = 0;
    uVar9 = 0;
    do {
      strncpy(pEVar5->name + lVar10,*(char **)((long)&(paVar13->name)._M_dataplus + lVar12),0xff);
      exr_header->channels->name[lVar10 + 0xff] = '\0';
      paVar13 = (info->channels).
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar5 = exr_header->channels;
      *(undefined4 *)((long)&pEVar5->pixel_type + lVar10) =
           *(undefined4 *)((long)&paVar13->pixel_type + lVar12);
      (&pEVar5->p_linear)[lVar10] = (&paVar13->p_linear)[lVar12];
      *(undefined8 *)((long)&pEVar5->x_sampling + lVar10) =
           *(undefined8 *)((long)&paVar13->x_sampling + lVar12);
      uVar9 = uVar9 + 1;
      iVar7 = exr_header->num_channels;
      lVar10 = lVar10 + 0x110;
      lVar12 = lVar12 + 0x30;
    } while (uVar9 < (ulong)(long)iVar7);
    __size = (long)iVar7 << 2;
  }
  piVar6 = (int *)malloc(__size);
  exr_header->pixel_types = piVar6;
  if (iVar7 == 0) {
    piVar6 = (int *)malloc(0);
    exr_header->requested_pixel_types = piVar6;
  }
  else {
    lVar12 = (long)iVar7;
    piVar8 = &paVar13->pixel_type;
    lVar10 = 0;
    do {
      piVar6[lVar10] = *piVar8;
      lVar10 = lVar10 + 1;
      piVar8 = piVar8 + 0xc;
    } while (lVar12 != lVar10);
    piVar6 = (int *)malloc(lVar12 * 4);
    exr_header->requested_pixel_types = piVar6;
    if (iVar7 != 0) {
      piVar8 = &paVar13->pixel_type;
      lVar10 = 0;
      do {
        piVar6[lVar10] = *piVar8;
        lVar10 = lVar10 + 1;
        piVar8 = piVar8 + 0xc;
      } while (lVar12 != lVar10);
    }
  }
  p_Var11 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  exr_header->num_custom_attributes = (int)((ulong)((long)p_Var2 - (long)p_Var11) >> 4) * 0x3e0f83e1
  ;
  if (p_Var2 != p_Var11) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      memcpy(exr_header->custom_attributes[0].name + lVar10,p_Var11->name + lVar10,0x100);
      puVar1 = (undefined4 *)((long)&exr_header->custom_attributes[0].size + lVar10);
      memcpy(puVar1 + -0x42,
             ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)->type + lVar10,0x100);
      p_Var11 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *puVar1 = *(undefined4 *)((long)&p_Var11->size + lVar10);
      *(undefined8 *)(puVar1 + -2) = *(undefined8 *)((long)&p_Var11->value + lVar10);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x210;
    } while (uVar9 < (ulong)(((long)(info->attributes).
                                    super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var11 >> 4)
                            * 0xf83e0f83e0f83e1));
  }
  exr_header->header_len = info->header_len;
  return;
}

Assistant:

static void ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window[0] = info.display_window[0];
  exr_header->display_window[1] = info.display_window[1];
  exr_header->display_window[2] = info.display_window[2];
  exr_header->display_window[3] = info.display_window[3];
  exr_header->data_window[0] = info.data_window[0];
  exr_header->data_window[1] = info.data_window[1];
  exr_header->data_window[2] = info.data_window[2];
  exr_header->data_window[3] = info.data_window[3];
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;

  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  assert(info.attributes.size() < TINYEXR_MAX_ATTRIBUTES);
  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  for (size_t i = 0; i < info.attributes.size(); i++) {
    memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name, 256);
    memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type, 256);
    exr_header->custom_attributes[i].size = info.attributes[i].size;
    // Just copy poiner
    exr_header->custom_attributes[i].value = info.attributes[i].value;
  }

  exr_header->header_len = info.header_len;
}